

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVariablesGeneric.cpp
# Opt level: O2

ChVariablesGeneric * __thiscall
chrono::ChVariablesGeneric::operator=(ChVariablesGeneric *this,ChVariablesGeneric *other)

{
  if (other != this) {
    ChVariables::operator=(&this->super_ChVariables,&other->super_ChVariables);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (&this->Mmass,&other->Mmass);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (&this->inv_Mmass,&other->inv_Mmass);
  }
  return this;
}

Assistant:

ChVariablesGeneric& ChVariablesGeneric::operator=(const ChVariablesGeneric& other) {
    if (&other == this)
        return *this;

    // copy parent class data
    ChVariables::operator=(other);

    Mmass = other.Mmass;
    inv_Mmass = other.inv_Mmass;

    return *this;
}